

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_reader.hpp
# Opt level: O2

bool IsInteger(char *str)

{
  char cVar1;
  long lVar2;
  char *ptr;
  
  lVar2 = 0;
  while( true ) {
    cVar1 = str[lVar2];
    if ((cVar1 == '\0') || ((9 < (int)cVar1 - 0x30U && ((lVar2 != 0 || (cVar1 != '-')))))) break;
    lVar2 = lVar2 + 1;
  }
  return cVar1 == '\0';
}

Assistant:

inline bool IsInteger(const char *str) {
    const char *ptr = str;
    while (*ptr != '\0') {
        if (std::isdigit(*ptr) ||
            (ptr == str && *ptr == '-')) 
        {
            ptr++;
            continue;
        }
        return false;
    }
    return true;
}